

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O2

void cfd::api::json::ElementsDecodeRawTransactionTxOut::CollectFieldName(void)

{
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> func_table;
  allocator local_f9;
  undefined1 local_f8 [48];
  code *local_c8;
  code *local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (json_mapper_abi_cxx11_._40_8_ == 0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_f8._8_8_ = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_f8._0_8_ = GetValueString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetValueString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_b8 = GetValueFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [6])0x4f6665,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"value",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetValue_minimumString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetValue_minimumString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetValue_minimumFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [14])"value-minimum",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"value-minimum",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetValue_maximumString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetValue_maximumString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetValue_maximumFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [14])"value-maximum",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"value-maximum",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetCt_exponentString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetCt_exponentString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetCt_exponentFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[12],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [12])"ct-exponent",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"ct-exponent",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetCt_bitsString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetCt_bitsString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetCt_bitsFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[8],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [8])"ct-bits",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"ct-bits",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetSurjectionproofString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetSurjectionproofString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetSurjectionproofFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"surjectionproof",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"surjectionproof",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetValuecommitmentString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetValuecommitmentString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetValuecommitmentFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"valuecommitment",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"valuecommitment",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetAssetString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetAssetString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetAssetFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[6],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [6])0x4c2aab,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"asset",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetAssetcommitmentString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetAssetcommitmentString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetAssetcommitmentFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"assetcommitment",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"assetcommitment",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetCommitmentnonceString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetCommitmentnonceString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetCommitmentnonceFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[16],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [16])"commitmentnonce",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"commitmentnonce",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetCommitmentnonce_fully_validString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetCommitmentnonce_fully_validString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetCommitmentnonce_fully_validFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[28],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [28])"commitmentnonce_fully_valid",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"commitmentnonce_fully_valid",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetNString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetNString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetNFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[2],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [2])0x51e015,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"n",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetScriptPubKeyString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetScriptPubKeyString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetScriptPubKeyFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[13],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [13])"scriptPubKey",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"scriptPubKey",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    local_f8._8_8_ = 0;
    local_f8._0_8_ = GetRangeproofString_abi_cxx11_;
    local_f8._24_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_invoke;
    local_f8._16_8_ =
         std::
         _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cfd::api::json::ElementsDecodeRawTransactionTxOut_&)>
         ::_M_manager;
    local_f8._40_8_ = 0;
    local_f8._32_8_ = SetRangeproofString;
    local_c0 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&),_void_(*)(cfd::api::json::ElementsDecodeRawTransactionTxOut_&,_const_UniValue_&)>
               ::_M_manager;
    local_b0 = 0;
    local_b8 = GetRangeproofFieldType_abi_cxx11_;
    local_a0 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_invoke;
    local_a8 = std::
               _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)()>
               ::_M_manager;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::operator=
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98,
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)local_f8);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
    ::
    _M_emplace_unique<char_const(&)[11],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>>>>
                *)json_mapper_abi_cxx11_,(char (*) [11])"rangeproof",
               (CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
    std::__cxx11::string::string((string *)local_f8,"rangeproof",&local_f9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               item_list_abi_cxx11_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut>::
    ~CLASS_FUNCTION_TABLE
              ((CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxOut> *)&local_98)
    ;
  }
  return;
}

Assistant:

XpubDataStruct XpubData::ConvertToStruct() const {  // NOLINT
  XpubDataStruct result;
  result.base58 = base58_;
  result.hex = hex_;
  result.ignore_items = ignore_items;
  return result;
}